

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O0

int evthread_set_condition_callbacks(evthread_condition_callbacks *cbs)

{
  evthread_condition_callbacks *__dest;
  evthread_condition_callbacks *target;
  evthread_condition_callbacks *cbs_local;
  
  __dest = evthread_get_condition_callbacks();
  if ((event_debug_mode_on_ != 0) && (event_debug_created_threadable_ctx_ != 0)) {
    event_errx(1,"evthread initialization must be called BEFORE anything else!");
  }
  if (cbs == (evthread_condition_callbacks *)0x0) {
    if (__dest->alloc_condition != (_func_void_ptr_uint *)0x0) {
      event_warnx(
                 "Trying to disable condition functions after they have been set up will probaby not work."
                 );
    }
    memset(__dest,0,0x28);
    cbs_local._4_4_ = 0;
  }
  else if (__dest->alloc_condition == (_func_void_ptr_uint *)0x0) {
    if ((((cbs->alloc_condition != (_func_void_ptr_uint *)0x0) &&
         (cbs->free_condition != (_func_void_void_ptr *)0x0)) &&
        (cbs->signal_condition != (_func_int_void_ptr_int *)0x0)) &&
       (cbs->wait_condition != (_func_int_void_ptr_void_ptr_timeval_ptr *)0x0)) {
      memcpy(__dest,cbs,0x28);
    }
    if (evthread_lock_debugging_enabled_ != 0) {
      evthread_cond_fns_.alloc_condition = cbs->alloc_condition;
      evthread_cond_fns_.free_condition = cbs->free_condition;
      evthread_cond_fns_.signal_condition = cbs->signal_condition;
    }
    cbs_local._4_4_ = 0;
  }
  else if (((__dest->condition_api_version == cbs->condition_api_version) &&
           (__dest->alloc_condition == cbs->alloc_condition)) &&
          ((__dest->free_condition == cbs->free_condition &&
           ((__dest->signal_condition == cbs->signal_condition &&
            (__dest->wait_condition == cbs->wait_condition)))))) {
    cbs_local._4_4_ = 0;
  }
  else {
    event_warnx("Can\'t change condition callbacks once they have been initialized.");
    cbs_local._4_4_ = -1;
  }
  return cbs_local._4_4_;
}

Assistant:

int
evthread_set_condition_callbacks(const struct evthread_condition_callbacks *cbs)
{
	struct evthread_condition_callbacks *target = evthread_get_condition_callbacks();

#ifndef EVENT__DISABLE_DEBUG_MODE
	if (event_debug_mode_on_) {
		if (event_debug_created_threadable_ctx_) {
		    event_errx(1, "evthread initialization must be called BEFORE anything else!");
		}
	}
#endif

	if (!cbs) {
		if (target->alloc_condition)
			event_warnx("Trying to disable condition functions "
			    "after they have been set up will probaby not "
			    "work.");
		memset(target, 0, sizeof(evthread_cond_fns_));
		return 0;
	}
	if (target->alloc_condition) {
		/* Uh oh; we already had condition callbacks set up.*/
		if (target->condition_api_version == cbs->condition_api_version &&
			target->alloc_condition == cbs->alloc_condition &&
			target->free_condition == cbs->free_condition &&
			target->signal_condition == cbs->signal_condition &&
			target->wait_condition == cbs->wait_condition) {
			/* no change -- allow this. */
			return 0;
		}
		event_warnx("Can't change condition callbacks once they "
		    "have been initialized.");
		return -1;
	}
	if (cbs->alloc_condition && cbs->free_condition &&
	    cbs->signal_condition && cbs->wait_condition) {
		memcpy(target, cbs, sizeof(evthread_cond_fns_));
	}
	if (evthread_lock_debugging_enabled_) {
		evthread_cond_fns_.alloc_condition = cbs->alloc_condition;
		evthread_cond_fns_.free_condition = cbs->free_condition;
		evthread_cond_fns_.signal_condition = cbs->signal_condition;
	}
	return 0;
}